

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O2

void __thiscall DNSResolve::Close(DNSResolve *this)

{
  string local_30 [32];
  
  Log::GetInstance();
  Log::FormatTime_abi_cxx11_();
  std::operator<<((ostream *)&std::cout,local_30);
  std::operator<<((ostream *)&std::cout," [info] ");
  std::operator<<((ostream *)&std::cout,"DNSResolve close\n");
  std::__cxx11::string::~string(local_30);
  this->is_closed_ = true;
  if (this->event_loop_ != (EventLoop *)0x0) {
    EventLoop::Remove(this->event_loop_,this->dns_socket_);
  }
  CloseSocket(this->dns_socket_);
  return;
}

Assistant:

void DNSResolve::Close()
{
    LOGI << "DNSResolve close\n";
    is_closed_ = true;
    if (event_loop_)
    {
        event_loop_->Remove(dns_socket_);
    }
    CloseSocket(dns_socket_);
}